

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManCollectRing(Gia_Man_t *p,Vec_Int_t *vStart,Vec_Int_t *vRes,Vec_Int_t *vDists)

{
  Vec_Int_t *p_00;
  int i;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  int i_00;
  int iVar7;
  
  i_00 = 0;
  while( true ) {
    if (vStart->nSize <= i_00) {
      return;
    }
    i = Vec_IntEntry(vStart,i_00);
    iVar1 = Vec_IntEntry(vDists,i);
    pGVar5 = Gia_ManObj(p,i);
    if (iVar1 < 1) break;
    uVar4 = (uint)*(ulong *)pGVar5;
    uVar6 = *(ulong *)pGVar5 & 0x1fffffff;
    if (uVar6 != 0x1fffffff && -1 < (int)uVar4) {
      uVar2 = Gia_ObjIsBuf(pGVar5 + -uVar6);
      Gia_ManRingAdd(p,i - (uVar4 & 0x1fffffff),vRes,vDists,(uVar2 ^ 1) + iVar1);
      uVar4 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20);
      uVar2 = Gia_ObjIsBuf(pGVar5 + -(ulong)(uVar4 & 0x1fffffff));
      Gia_ManRingAdd(p,i - (uVar4 & 0x1fffffff),vRes,vDists,(uVar2 ^ 1) + iVar1);
    }
    iVar7 = 0;
    while( true ) {
      iVar3 = Vec_IntEntry(p->vFanoutNums,i);
      if (iVar3 <= iVar7) break;
      p_00 = p->vFanout;
      iVar3 = Vec_IntEntry(p_00,i);
      iVar3 = Vec_IntEntry(p_00,iVar3 + iVar7);
      pGVar5 = Gia_ManObj(p,iVar3);
      uVar4 = Gia_ObjIsBuf(pGVar5);
      Gia_ManRingAdd(p,iVar3,vRes,vDists,(uVar4 ^ 1) + iVar1);
      iVar7 = iVar7 + 1;
    }
    i_00 = i_00 + 1;
  }
  __assert_fail("Weight > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x91c,"void Gia_ManCollectRing(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

void Gia_ManCollectRing( Gia_Man_t * p, Vec_Int_t * vStart, Vec_Int_t * vRes, Vec_Int_t * vDists )
{
    int i, k, iObj, iFan;
    Vec_IntForEachEntry( vStart, iObj, i )
    {
        int Weight = Vec_IntEntry( vDists, iObj );
        Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
        assert( Weight > 0 );
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ManRingAdd( p, Gia_ObjFaninId0(pObj, iObj), vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ObjFanin0(pObj)) );
            Gia_ManRingAdd( p, Gia_ObjFaninId1(pObj, iObj), vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ObjFanin1(pObj)) );
        }
        Gia_ObjForEachFanoutStaticId( p, iObj, iFan, k )
            Gia_ManRingAdd( p, iFan, vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ManObj(p, iFan)) );
    }
}